

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_geom.cxx
# Opt level: O3

void __thiscall xray_re::xr_level_geom::load_d3d9(xr_level_geom *this,xr_reader *r)

{
  uint uVar1;
  uint *puVar2;
  pointer pxVar3;
  d3d_vertex_element *ve;
  d3d_vertex_element *pdVar4;
  pointer pxVar5;
  pointer pxVar6;
  bool bVar7;
  xr_reader *r_00;
  d3d_vertex_element *pdVar8;
  size_t n_ve;
  pointer this_00;
  pointer this_01;
  pointer this_02;
  xr_reader *s;
  xr_reader *local_30;
  
  r_00 = xr_reader::open_chunk(r,9);
  local_30 = r_00;
  if (r_00 == (xr_reader *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                  ,0x55,"void xray_re::xr_level_geom::load_d3d9(xr_reader &)");
  }
  puVar2 = (r_00->field_2).m_p_u32;
  (r_00->field_2).m_p = (uint8_t *)(puVar2 + 1);
  std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
            (&this->m_vbufs,(ulong)*puVar2);
  this_00 = (this->m_vbufs).super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pxVar3 = (this->m_vbufs).super__Vector_base<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (this_00 == pxVar3) {
      xr_reader::close_chunk(r,&local_30);
      local_30 = xr_reader::open_chunk(r,10);
      if (local_30 == (xr_reader *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                      ,0x60,"void xray_re::xr_level_geom::load_d3d9(xr_reader &)");
      }
      puVar2 = (local_30->field_2).m_p_u32;
      (local_30->field_2).m_p = (uint8_t *)(puVar2 + 1);
      std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::resize
                (&this->m_ibufs,(ulong)*puVar2);
      pxVar5 = (this->m_ibufs).
               super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_01 = (this->m_ibufs).
                     super__Vector_base<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>._M_impl
                     .super__Vector_impl_data._M_start; this_01 != pxVar5; this_01 = this_01 + 1) {
        puVar2 = (local_30->field_2).m_p_u32;
        (local_30->field_2).m_p = (uint8_t *)(puVar2 + 1);
        xr_ibuf::load(this_01,local_30,(ulong)*puVar2);
      }
      xr_reader::close_chunk(r,&local_30);
      local_30 = xr_reader::open_chunk(r,0xb);
      if (local_30 == (xr_reader *)0x0) {
        __assert_fail("s",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                      ,0x67,"void xray_re::xr_level_geom::load_d3d9(xr_reader &)");
      }
      puVar2 = (local_30->field_2).m_p_u32;
      (local_30->field_2).m_p = (uint8_t *)(puVar2 + 1);
      std::vector<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>::resize
                (&this->m_swibufs,(ulong)*puVar2);
      pxVar6 = (this->m_swibufs).
               super__Vector_base<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_02 = (this->m_swibufs).
                     super__Vector_base<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>.
                     _M_impl.super__Vector_impl_data._M_start; this_02 != pxVar6;
          this_02 = this_02 + 1) {
        xr_swibuf::load(this_02,local_30);
      }
      xr_reader::close_chunk(r,&local_30);
      return;
    }
    ve = (d3d_vertex_element *)(r_00->field_2).m_p;
    pdVar4 = (d3d_vertex_element *)r_00->m_end;
    (r_00->field_2).m_p = (uint8_t *)(ve + 1);
    if ((pdVar4 < ve + 1) || ((r_00->field_2).m_p = (uint8_t *)(ve + 2), pdVar4 < ve + 2)) break;
    n_ve = 1;
    pdVar8 = ve + 3;
    while (pdVar8[-2].type != '\x11') {
      n_ve = n_ve + 1;
      (r_00->field_2).m_p = (uint8_t *)pdVar8;
      bVar7 = pdVar4 < pdVar8;
      pdVar8 = pdVar8 + 1;
      if (bVar7) goto LAB_00169efa;
    }
    (r_00->field_2).m_p = &pdVar8[-1].type;
    uVar1._0_2_ = pdVar8[-1].stream;
    uVar1._2_2_ = pdVar8[-1].offset;
    xr_vbuf::load_d3d9(this_00,r_00,(ulong)uVar1,ve,n_ve);
    this_00 = this_00 + 1;
  }
LAB_00169efa:
  __assert_fail("m_p <= m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                ,0x7c,"void xray_re::xr_reader::advance(size_t)");
}

Assistant:

void xr_level_geom::load_d3d9(xr_reader& r)
{
	xr_reader* s = r.open_chunk(FSL13_VB);
	xr_assert(s);
	m_vbufs.resize(s->r_u32());
	for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
		const d3d_vertex_element *ve = s->skip<d3d_vertex_element>();
		size_t n_ve = 1;
		for (; s->skip<d3d_vertex_element>()->type != D3D_VE_TYPE_UNUSED; ++n_ve) {}
		it->load_d3d9(*s, s->r_u32(), ve, n_ve);
	}
	r.close_chunk(s);

	s = r.open_chunk(FSL13_IB);
	xr_assert(s);
	m_ibufs.resize(s->r_u32());
	for (xr_ibuf_vec_it it = m_ibufs.begin(), end = m_ibufs.end(); it != end; ++it)
		it->load(*s, s->r_u32());
	r.close_chunk(s);

	s = r.open_chunk(FSL13_SWIS);
	xr_assert(s);
	m_swibufs.resize(s->r_u32());
	for (xr_swibuf_vec_it it = m_swibufs.begin(), end = m_swibufs.end(); it != end; ++it)
		it->load(*s);
	r.close_chunk(s);
}